

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

bool __thiscall anon_unknown.dwarf_ea0a0::DebGenerator::generateDataTar(DebGenerator *this)

{
  cmCPackLog *pcVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong skip;
  void *this_00;
  reference pbVar6;
  reference pbVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string local_f08 [32];
  string local_ee8;
  undefined1 local_ec8 [8];
  ostringstream cmCPackLog_msg_5;
  string local_d50;
  string local_d30 [32];
  undefined1 local_d10 [8];
  ostringstream cmCPackLog_msg_4;
  string local_b98 [8];
  string relativeDir;
  size_type slashPos;
  undefined1 local_b50 [8];
  ostringstream cmCPackLog_msg_3;
  string *file;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_9b0;
  string local_990;
  _Base_ptr local_970;
  undefined1 local_968;
  undefined1 local_960 [8];
  string currentPath;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  orderedFiles;
  undefined1 local_8d8 [8];
  ostringstream cmCPackLog_msg_2;
  size_t topLevelLength;
  string local_750;
  allocator<char> local_729;
  string local_728;
  string local_708 [32];
  string local_6e8;
  undefined1 local_6c8 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_550 [8];
  cmArchiveWrite data_tar;
  string local_468 [32];
  undefined1 local_448 [8];
  ostringstream cmCPackLog_msg;
  undefined1 local_2d0 [8];
  cmGeneratedFileStream fileStream_data_tar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string filename_data_tar;
  DebGenerator *this_local;
  
  filename_data_tar.field_2._8_8_ = this;
  std::operator+(&local_58,&this->WorkDir,"/data.tar");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,&this->CompressionSuffix);
  std::__cxx11::string::~string((string *)&local_58);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2d0,None);
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_2d0,(string *)local_38,false,true);
  bVar2 = std::ios::operator!((ios *)(local_2d0 + (long)*(_func_int **)((long)local_2d0 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_550,(ostream *)local_2d0,this->TarCompressionType,
               &this->DebianArchiveType,0,(int)this->NumThreads);
    bVar3 = cmArchiveWrite::Open((cmArchiveWrite *)local_550);
    if (bVar3) {
      cmArchiveWrite::SetUIDAndGID((cmArchiveWrite *)local_550,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"root",&local_729);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_750,"root",(allocator<char> *)((long)&topLevelLength + 7));
      cmArchiveWrite::SetUNAMEAndGNAME((cmArchiveWrite *)local_550,&local_728,&local_750);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator((allocator<char> *)((long)&topLevelLength + 7));
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      skip = std::__cxx11::string::length();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d8);
      poVar4 = std::operator<<((ostream *)local_8d8,"WDIR: \"");
      poVar4 = std::operator<<(poVar4,(string *)&this->WorkDir);
      poVar4 = std::operator<<(poVar4,"\", length = ");
      this_00 = (void *)std::ostream::operator<<(poVar4,skip);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0xd8,pcVar5);
      std::__cxx11::string::~string
                ((string *)&orderedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->PackageFiles);
      currentPath.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->PackageFiles);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&currentPath.field_2 + 8)), bVar3) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::string::string((string *)local_960,(string *)pbVar6);
        while (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_960,&this->WorkDir), bVar3) {
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range1,(value_type *)local_960);
          local_970 = (_Base_ptr)pVar8.first._M_node;
          local_968 = pVar8.second;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9b0,"..",(allocator<char> *)((long)&__range1_1 + 7));
          cmsys::SystemTools::CollapseFullPath(&local_990,&local_9b0,(string *)local_960);
          std::__cxx11::string::operator=((string *)local_960,(string *)&local_990);
          std::__cxx11::string::~string((string *)&local_990);
          std::__cxx11::string::~string((string *)&local_9b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
        }
        std::__cxx11::string::~string((string *)local_960);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      __end1_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      file = (string *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
      while (bVar3 = std::operator!=(&__end1_1,(_Self *)&file), bVar3) {
        pbVar7 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1_1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b50);
        poVar4 = std::operator<<((ostream *)local_b50,"FILEIT: \"");
        poVar4 = std::operator<<(poVar4,(string *)pbVar7);
        poVar4 = std::operator<<(poVar4,"\"");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0xe9,pcVar5);
        std::__cxx11::string::~string((string *)&slashPos);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b50);
        relativeDir.field_2._8_8_ = std::__cxx11::string::find((char)pbVar7,0x2f);
        std::__cxx11::string::substr((ulong)local_b98,(ulong)pbVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d10);
        poVar4 = std::operator<<((ostream *)local_d10,"RELATIVEDIR: \"");
        poVar4 = std::operator<<(poVar4,local_b98);
        poVar4 = std::operator<<(poVar4,"\"");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0xee,pcVar5);
        std::__cxx11::string::~string(local_d30);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d10);
        std::__cxx11::string::string((string *)&local_d50,(string *)pbVar7);
        bVar3 = cmArchiveWrite::Add((cmArchiveWrite *)local_550,&local_d50,skip,".",false);
        std::__cxx11::string::~string((string *)&local_d50);
        bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ec8);
          poVar4 = std::operator<<((ostream *)local_ec8,
                                   "Problem adding file to tar:\n#top level directory: ");
          poVar4 = std::operator<<(poVar4,(string *)&this->WorkDir);
          poVar4 = std::operator<<(poVar4,"\n#file: ");
          poVar4 = std::operator<<(poVar4,(string *)pbVar7);
          poVar4 = std::operator<<(poVar4,"\n#error:");
          cmArchiveWrite::GetError_abi_cxx11_(&local_ee8,(cmArchiveWrite *)local_550);
          poVar4 = std::operator<<(poVar4,(string *)&local_ee8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_ee8);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                          ,0x10e,pcVar5);
          std::__cxx11::string::~string(local_f08);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ec8);
          this_local._7_1_ = 0;
        }
        data_tar.PermissionsMask._5_3_ = 0;
        data_tar.PermissionsMask.IsValueSet = bVar3;
        std::__cxx11::string::~string(local_b98);
        if (data_tar.PermissionsMask._4_4_ != 0) goto LAB_001dc0ea;
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1_1);
      }
      this_local._7_1_ = 1;
      data_tar.PermissionsMask.IsValueSet = true;
      data_tar.PermissionsMask._5_3_ = 0;
LAB_001dc0ea:
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      poVar4 = std::operator<<((ostream *)local_6c8,"Error opening the archive \"");
      poVar4 = std::operator<<(poVar4,(string *)local_38);
      poVar4 = std::operator<<(poVar4,"\", ERROR = ");
      cmArchiveWrite::GetError_abi_cxx11_(&local_6e8,(cmArchiveWrite *)local_550);
      poVar4 = std::operator<<(poVar4,(string *)&local_6e8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_6e8);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,200,pcVar5);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
      this_local._7_1_ = 0;
      data_tar.PermissionsMask.IsValueSet = true;
      data_tar.PermissionsMask._5_3_ = 0;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_550);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
    poVar4 = std::operator<<((ostream *)local_448,"Error opening the file \"");
    poVar4 = std::operator<<(poVar4,(string *)local_38);
    poVar4 = std::operator<<(poVar4,"\" for writing");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0xbe,pcVar5);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
    this_local._7_1_ = 0;
    data_tar.PermissionsMask.IsValueSet = true;
    data_tar.PermissionsMask._5_3_ = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2d0);
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DebGenerator::generateDataTar() const
{
  std::string filename_data_tar =
    this->WorkDir + "/data.tar" + this->CompressionSuffix;
  cmGeneratedFileStream fileStream_data_tar;
  fileStream_data_tar.Open(filename_data_tar, false, true);
  if (!fileStream_data_tar) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error opening the file \""
                    << filename_data_tar << "\" for writing" << std::endl);
    return false;
  }
  cmArchiveWrite data_tar(fileStream_data_tar, this->TarCompressionType,
                          this->DebianArchiveType, 0,
                          static_cast<int>(this->NumThreads));
  if (!data_tar.Open()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error opening the archive \""
                    << filename_data_tar
                    << "\", ERROR = " << data_tar.GetError() << std::endl);
    return false;
  }

  // uid/gid should be the one of the root user, and this root user has
  // always uid/gid equal to 0.
  data_tar.SetUIDAndGID(0U, 0U);
  data_tar.SetUNAMEAndGNAME("root", "root");

  // now add all directories which have to be compressed
  // collect all top level install dirs for that
  // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would
  // give /usr and /opt
  size_t topLevelLength = this->WorkDir.length();
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "WDIR: \"" << this->WorkDir
                           << "\", length = " << topLevelLength << std::endl);
  std::set<std::string> orderedFiles;

  // we have to reconstruct the parent folders as well

  for (std::string currentPath : this->PackageFiles) {
    while (currentPath != this->WorkDir) {
      // the last one IS WorkDir, but we do not want this one:
      // XXX/application/usr/bin/myprogram with GEN_WDIR=XXX/application
      // should not add XXX/application
      orderedFiles.insert(currentPath);
      currentPath = cmSystemTools::CollapseFullPath("..", currentPath);
    }
  }

  for (std::string const& file : orderedFiles) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "FILEIT: \"" << file << "\"" << std::endl);
    std::string::size_type slashPos = file.find('/', topLevelLength + 1);
    std::string relativeDir =
      file.substr(topLevelLength, slashPos - topLevelLength);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "RELATIVEDIR: \"" << relativeDir << "\"" << std::endl);

#ifdef _WIN32
    std::string mode_t_adt_filename = file + ":cmake_mode_t";
    cmsys::ifstream permissionStream(mode_t_adt_filename.c_str());

    mode_t permissions = 0;

    if (permissionStream) {
      permissionStream >> std::oct >> permissions;
    }

    if (permissions != 0) {
      data_tar.SetPermissions(permissions);
    } else if (cmSystemTools::FileIsDirectory(file)) {
      data_tar.SetPermissions(0755);
    } else {
      data_tar.ClearPermissions();
    }
#endif

    // do not recurse because the loop will do it
    if (!data_tar.Add(file, topLevelLength, ".", false)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem adding file to tar:\n"
                    "#top level directory: "
                      << this->WorkDir
                      << "\n"
                         "#file: "
                      << file
                      << "\n"
                         "#error:"
                      << data_tar.GetError() << std::endl);
      return false;
    }
  }
  return true;
}